

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_builder.c
# Opt level: O1

int TryGetHexDigit(char **src,char *end)

{
  byte bVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)*src;
  if (pbVar2 != (byte *)end) {
    bVar1 = *pbVar2;
    *src = (char *)(pbVar2 + 1);
    if ((byte)(bVar1 - 0x30) < 10) {
      return bVar1 - 0x30;
    }
    if ((byte)((bVar1 | 0x20) + 0x9f) < 6) {
      return (bVar1 | 0x20) - 0x57;
    }
    *src = *src + -1;
  }
  return -1;
}

Assistant:

static int TryGetHexDigit(const char** src, const char* end) {
  char ch;
  if (!TryGetChar(src, end, &ch)) return -1;
  if ('0' <= ch && ch <= '9') {
    return ch - '0';
  }
  ch = upb_ascii_lower(ch);
  if ('a' <= ch && ch <= 'f') {
    return ch - 'a' + 0xa;
  }
  *src -= 1;  // Char wasn't actually a hex digit.
  return -1;
}